

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::doAddCol(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *objValue,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *lowerValue,
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *colVec,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *upperValue,bool scale)

{
  DataKey *pDVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  pointer pnVar5;
  bool bVar6;
  int iVar7;
  double *pdVar8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar9;
  long lVar10;
  Item *pIVar11;
  cpp_dec_float<50U,_int,_void> *pcVar12;
  long lVar13;
  int idx;
  uint local_278;
  int local_26c;
  Item *local_268;
  undefined8 uStack_260;
  _func_int **local_250;
  long local_248;
  DataKey local_240;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_238;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  int local_1d0;
  undefined1 local_1cc;
  undefined8 local_1c8;
  undefined1 local_1b8 [8];
  DataKey DStack_1b0;
  uint local_1a8 [3];
  undefined3 uStack_19b;
  uint local_198;
  undefined3 uStack_193;
  int local_190;
  bool local_18c;
  undefined8 local_188;
  _func_int **local_110;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  int local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  int local_80;
  undefined1 local_7c;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  iVar3 = (this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  iVar4 = (this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  local_238.m_backend.data._M_elems._0_8_ =
       local_238.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
  local_1b8._0_4_ = 0;
  local_1b8._4_4_ = -1;
  local_26c = iVar3;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::add(&this->
         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ,(DataKey *)local_1b8,objValue,lowerValue,colVec,upperValue,(int *)&local_238);
  if (this->thesense != MAXIMIZE) {
    local_1b8._0_4_ = -1;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
    ::operator*=((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                  *)((this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar3),(int *)local_1b8);
  }
  if (scale) {
    local_278 = (*this->lp_scaler->_vptr_SPxScaler[1])
                          (this->lp_scaler,colVec,
                           &(this->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).scaleExp);
    pcVar12 = &(this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar3].m_backend;
    ::soplex::infinity::__tls_init();
    pdVar8 = (double *)__tls_get_addr(&PTR_003b4b70);
    local_268 = (Item *)*pdVar8;
    local_188._0_4_ = cpp_dec_float_finite;
    local_188._4_4_ = 10;
    local_1b8._0_4_ = 0;
    local_1b8._4_4_ = 0;
    DStack_1b0.info = 0;
    DStack_1b0.idx = 0;
    local_1a8[0] = 0;
    local_1a8[1] = 0;
    stack0xfffffffffffffe60 = 0;
    uStack_19b = 0;
    _local_198 = 0;
    uStack_193 = 0;
    local_190 = 0;
    local_18c = false;
    uStack_260 = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_1b8,(double)local_268);
    if (((pcVar12->fpclass != cpp_dec_float_NaN) && ((fpclass_type)local_188 != cpp_dec_float_NaN))
       && (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (pcVar12,(cpp_dec_float<50U,_int,_void> *)local_1b8), iVar7 < 0)) {
      pnVar5 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_48 = *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 8);
      local_68 = *(undefined8 *)&pnVar5[iVar3].m_backend.data;
      uStack_60 = *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 2);
      puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 4;
      local_58 = *(undefined8 *)puVar2;
      uStack_50 = *(undefined8 *)(puVar2 + 2);
      local_40 = pnVar5[iVar3].m_backend.exp;
      local_3c = pnVar5[iVar3].m_backend.neg;
      local_38._0_4_ = pnVar5[iVar3].m_backend.fpclass;
      local_38._4_4_ = pnVar5[iVar3].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)local_1b8,(soplex *)&local_68,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)-local_278,CONCAT31((int3)((uint)local_40 >> 8),local_3c));
      pnVar5 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)(pnVar5[iVar3].m_backend.data._M_elems + 8) = CONCAT35(uStack_193,_local_198);
      puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = local_1a8._0_8_;
      *(ulong *)(puVar2 + 2) = CONCAT35(uStack_19b,stack0xfffffffffffffe60);
      pDVar1 = (DataKey *)(pnVar5 + iVar3);
      pDVar1->info = local_1b8._0_4_;
      pDVar1->idx = local_1b8._4_4_;
      pDVar1[1] = DStack_1b0;
      pnVar5[iVar3].m_backend.exp = local_190;
      pnVar5[iVar3].m_backend.neg = local_18c;
      pnVar5[iVar3].m_backend.fpclass = (fpclass_type)local_188;
      pnVar5[iVar3].m_backend.prec_elem = local_188._4_4_;
    }
    pcVar12 = &(this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar3].m_backend;
    ::soplex::infinity::__tls_init();
    local_188._0_4_ = cpp_dec_float_finite;
    local_188._4_4_ = 10;
    local_1b8._0_4_ = 0;
    local_1b8._4_4_ = 0;
    DStack_1b0.info = 0;
    DStack_1b0.idx = 0;
    local_1a8[0] = 0;
    local_1a8[1] = 0;
    stack0xfffffffffffffe60 = 0;
    uStack_19b = 0;
    _local_198 = 0;
    uStack_193 = 0;
    local_190 = 0;
    local_18c = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_1b8,-(double)local_268);
    if (((pcVar12->fpclass != cpp_dec_float_NaN) && ((fpclass_type)local_188 != cpp_dec_float_NaN))
       && (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (pcVar12,(cpp_dec_float<50U,_int,_void> *)local_1b8), 0 < iVar7)) {
      pnVar5 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_88 = *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 8);
      local_a8 = *(undefined8 *)&pnVar5[iVar3].m_backend.data;
      uStack_a0 = *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 2);
      puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 4;
      local_98 = *(undefined8 *)puVar2;
      uStack_90 = *(undefined8 *)(puVar2 + 2);
      local_80 = pnVar5[iVar3].m_backend.exp;
      local_7c = pnVar5[iVar3].m_backend.neg;
      local_78._0_4_ = pnVar5[iVar3].m_backend.fpclass;
      local_78._4_4_ = pnVar5[iVar3].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)local_1b8,(soplex *)&local_a8,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)-local_278,CONCAT31((int3)((uint)local_80 >> 8),local_7c));
      pnVar5 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)(pnVar5[iVar3].m_backend.data._M_elems + 8) = CONCAT35(uStack_193,_local_198);
      puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = local_1a8._0_8_;
      *(ulong *)(puVar2 + 2) = CONCAT35(uStack_19b,stack0xfffffffffffffe60);
      pDVar1 = (DataKey *)(pnVar5 + iVar3);
      pDVar1->info = local_1b8._0_4_;
      pDVar1->idx = local_1b8._4_4_;
      pDVar1[1] = DStack_1b0;
      pnVar5[iVar3].m_backend.exp = local_190;
      pnVar5[iVar3].m_backend.neg = local_18c;
      pnVar5[iVar3].m_backend.fpclass = (fpclass_type)local_188;
      pnVar5[iVar3].m_backend.prec_elem = local_188._4_4_;
    }
    pnVar5 = (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_c8 = *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 8);
    local_e8 = *(undefined8 *)&pnVar5[iVar3].m_backend.data;
    uStack_e0 = *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 2);
    puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 4;
    local_d8 = *(undefined8 *)puVar2;
    uStack_d0 = *(undefined8 *)(puVar2 + 2);
    local_c0 = pnVar5[iVar3].m_backend.exp;
    local_bc = pnVar5[iVar3].m_backend.neg;
    local_b8._0_4_ = pnVar5[iVar3].m_backend.fpclass;
    local_b8._4_4_ = pnVar5[iVar3].m_backend.prec_elem;
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)local_1b8,(soplex *)&local_e8,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(ulong)local_278,CONCAT31((int3)((uint)local_c0 >> 8),local_bc));
    pnVar5 = (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(ulong *)(pnVar5[iVar3].m_backend.data._M_elems + 8) = CONCAT35(uStack_193,_local_198);
    puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = local_1a8._0_8_;
    *(ulong *)(puVar2 + 2) = CONCAT35(uStack_19b,stack0xfffffffffffffe60);
    pDVar1 = (DataKey *)(pnVar5 + iVar3);
    pDVar1->info = local_1b8._0_4_;
    pDVar1->idx = local_1b8._4_4_;
    pDVar1[1] = DStack_1b0;
    pnVar5[iVar3].m_backend.exp = local_190;
    pnVar5[iVar3].m_backend.neg = local_18c;
    pnVar5[iVar3].m_backend.fpclass = (fpclass_type)local_188;
    pnVar5[iVar3].m_backend.prec_elem = local_188._4_4_;
    (this->
    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).scaleExp.data[iVar3] = local_278;
  }
  else {
    local_278 = 0;
  }
  pIVar11 = (this->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem;
  iVar3 = (this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thekey[iVar3].idx;
  lVar10 = (long)pIVar11[iVar3].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
  if (0 < lVar10) {
    pIVar11 = pIVar11 + iVar3;
    local_250 = (_func_int **)&PTR__DSVectorBase_003b2428;
    local_268 = pIVar11;
    do {
      lVar13 = lVar10 + -1;
      pNVar9 = (pIVar11->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      iVar3 = pNVar9[lVar10 + -1].idx;
      if (scale) {
        local_1f8 = *(undefined8 *)&pNVar9[lVar13].val.m_backend.data;
        uStack_1f0 = *(undefined8 *)(pNVar9[lVar13].val.m_backend.data._M_elems + 2);
        puVar2 = pNVar9[lVar13].val.m_backend.data._M_elems + 4;
        local_1e8 = *(undefined8 *)puVar2;
        uStack_1e0 = *(undefined8 *)(puVar2 + 2);
        local_1d8 = *(undefined8 *)(pNVar9[lVar13].val.m_backend.data._M_elems + 8);
        local_1d0 = pNVar9[lVar13].val.m_backend.exp;
        local_1cc = pNVar9[lVar13].val.m_backend.neg;
        local_1c8._0_4_ = pNVar9[lVar13].val.m_backend.fpclass;
        local_1c8._4_4_ = pNVar9[lVar13].val.m_backend.prec_elem;
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)local_1b8,(soplex *)&local_1f8,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)((this->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).scaleExp.data[iVar3] + local_278),
                   CONCAT31((int3)((uint)local_1d0 >> 8),local_1cc));
        pNVar9 = (local_268->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        *(ulong *)(pNVar9[lVar13].val.m_backend.data._M_elems + 8) = CONCAT35(uStack_193,_local_198)
        ;
        puVar2 = pNVar9[lVar13].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = local_1a8._0_8_;
        *(ulong *)(puVar2 + 2) = CONCAT35(uStack_19b,stack0xfffffffffffffe60);
        *(undefined1 (*) [8])&pNVar9[lVar13].val.m_backend.data = local_1b8;
        *(DataKey *)(pNVar9[lVar13].val.m_backend.data._M_elems + 2) = DStack_1b0;
        pNVar9[lVar13].val.m_backend.exp = local_190;
        pNVar9[lVar13].val.m_backend.neg = local_18c;
        pNVar9[lVar13].val.m_backend.fpclass = (fpclass_type)local_188;
        pNVar9[lVar13].val.m_backend.prec_elem = local_188._4_4_;
        pNVar9 = (local_268->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        pIVar11 = local_268;
      }
      local_238.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pNVar9[lVar13].val.m_backend.data._M_elems + 8);
      local_238.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pNVar9[lVar13].val.m_backend.data;
      local_238.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pNVar9[lVar13].val.m_backend.data._M_elems + 2);
      puVar2 = pNVar9[lVar13].val.m_backend.data._M_elems + 4;
      local_238.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_238.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_238.m_backend.exp = pNVar9[lVar13].val.m_backend.exp;
      local_238.m_backend.neg = pNVar9[lVar13].val.m_backend.neg;
      local_238.m_backend.fpclass = pNVar9[lVar13].val.m_backend.fpclass;
      local_238.m_backend.prec_elem = pNVar9[lVar13].val.m_backend.prec_elem;
      if ((this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum <= iVar3) {
        local_248 = lVar13;
        LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::LPRowBase((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)local_1b8,0);
        iVar7 = (this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum;
        if (iVar7 <= iVar3) {
          iVar7 = (iVar3 - iVar7) + 1;
          do {
            local_240.info = 0;
            local_240.idx = -1;
            LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add(&this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,&local_240,
                  (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)local_1b8);
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
        local_110 = local_250;
        pIVar11 = local_268;
        lVar13 = local_248;
        if (local_f8 !=
            (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0) {
          free(local_f8);
          pIVar11 = local_268;
          lVar13 = local_248;
        }
      }
      LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add2(&this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,iVar3,1,&local_26c,&local_238);
      bVar6 = 1 < lVar10;
      lVar10 = lVar13;
    } while (bVar6);
  }
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x51])(this,1);
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x50])
            (this,(ulong)(uint)((this->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .set.thenum - iVar4));
  return;
}

Assistant:

void doAddCol(const R& objValue, const R& lowerValue, const SVectorBase<R>& colVec,
                 const R& upperValue, bool scale = false)
   {
      int idx = nCols();
      int oldRowNumber = nRows();
      int newColScaleExp = 0;

      LPColSetBase<R>::add(objValue, lowerValue, colVec, upperValue);

      if(thesense != MAXIMIZE)
         LPColSetBase<R>::maxObj_w(idx) *= -1;

      DataArray <int>& rowscaleExp = LPRowSetBase<R>::scaleExp;

      // compute new column scaling factor and apply it to the bounds
      if(scale)
      {
         newColScaleExp = lp_scaler->computeScaleExp(colVec, rowscaleExp);

         if(upper(idx) < R(infinity))
            upper_w(idx) = spxLdexp(upper_w(idx), - newColScaleExp);

         if(lower(idx) > R(-infinity))
            lower_w(idx) = spxLdexp(lower_w(idx), - newColScaleExp);

         maxObj_w(idx) = spxLdexp(maxObj_w(idx), newColScaleExp);

         LPColSetBase<R>::scaleExp[idx] = newColScaleExp;
      }

      SVectorBase<R>& vec = colVector_w(idx);

      // now insert nonzeros to row file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newColScaleExp + rowscaleExp[i]);

         R val = vec.value(j);

         // create new rows if required
         if(i >= nRows())
         {
            LPRowBase<R> empty;

            for(int k = nRows(); k <= i; ++k)
               LPRowSetBase<R>::add(empty);
         }

         assert(i < nRows());
         LPRowSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedCols(1);
      addedRows(nRows() - oldRowNumber);
   }